

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O0

IGUITab * __thiscall irr::gui::CGUITabControl::addTab(CGUITabControl *this,wchar_t *caption,s32 id)

{
  u32 uVar1;
  IGUITab *pIVar2;
  EGUI_ALIGNMENT in_EDX;
  IGUIElement *in_RSI;
  IGUIEnvironment *in_RDI;
  CGUITab *unaff_retaddr;
  CGUITab *tab;
  IGUITab **in_stack_ffffffffffffffa8;
  CGUITabControl *this_00;
  undefined8 in_stack_ffffffffffffffe0;
  s32 id_00;
  EGUI_ALIGNMENT in_stack_ffffffffffffffe8;
  IGUIEnvironment *environment;
  
  id_00 = (s32)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  environment = in_RDI;
  pIVar2 = (IGUITab *)operator_new(0x160);
  this_00 = *(CGUITabControl **)&in_RDI[9].field_0x8;
  calcTabPos(this_00);
  CGUITab::CGUITab(unaff_retaddr,environment,in_RSI,
                   (rect<int> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),id_00);
  (*(pIVar2->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x14])(pIVar2,in_RSI);
  IGUIElement::setAlignment
            (in_RSI,in_EDX,in_stack_ffffffffffffffe8,(EGUI_ALIGNMENT)((ulong)pIVar2 >> 0x20),
             (EGUI_ALIGNMENT)pIVar2);
  (*(pIVar2->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0xf])(pIVar2,0);
  core::array<irr::gui::IGUITab_*>::push_back
            ((array<irr::gui::IGUITab_*> *)this_00,in_stack_ffffffffffffffa8);
  if (*(int *)&in_RDI[10].field_0x18 == -1) {
    uVar1 = core::array<irr::gui::IGUITab_*>::size((array<irr::gui::IGUITab_*> *)0x3cf67f);
    *(u32 *)&in_RDI[10].field_0x18 = uVar1 - 1;
    (*(pIVar2->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0xf])(pIVar2,1);
  }
  recalculateScrollBar(this_00);
  return pIVar2;
}

Assistant:

IGUITab *CGUITabControl::addTab(const wchar_t *caption, s32 id)
{
	CGUITab *tab = new CGUITab(Environment, this, calcTabPos(), id);

	tab->setText(caption);
	tab->setAlignment(EGUIA_UPPERLEFT, EGUIA_LOWERRIGHT, EGUIA_UPPERLEFT, EGUIA_LOWERRIGHT);
	tab->setVisible(false);
	Tabs.push_back(tab); // no grab as new already creates a reference

	if (ActiveTabIndex == -1) {
		ActiveTabIndex = Tabs.size() - 1;
		tab->setVisible(true);
	}

	recalculateScrollBar();

	return tab;
}